

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_test.cpp
# Opt level: O2

void flatbuffers::tests::ReflectionTest(string *tests_data_path,uint8_t *flatbuf,size_t length)

{
  double dVar1;
  pointer puVar2;
  bool bVar3;
  return_type expval;
  uint16_t expval_00;
  unsigned_short uVar4;
  BaseType BVar5;
  Offset<flatbuffers::String> root;
  Offset<const_flatbuffers::Table_*> root_00;
  Object *pOVar6;
  String *pSVar7;
  Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *pVVar8;
  return_type pOVar9;
  Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int> *this;
  return_type this_00;
  Vector<flatbuffers::Offset<reflection::SchemaFile>,_unsigned_int> *pVVar10;
  return_type pSVar11;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *pVVar12;
  return_type pSVar13;
  Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *this_01;
  Table *table;
  Type *pTVar14;
  return_type pFVar15;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *pVVar16;
  return_type pKVar17;
  char *pcVar18;
  return_type pFVar19;
  Object *pOVar20;
  int64_t iVar21;
  Struct *pSVar22;
  Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *pVVar23;
  Vector<unsigned_char,_unsigned_int> *vec;
  uint8_t *puVar24;
  int __c;
  int __c_00;
  long lVar25;
  Schema *schema;
  pointer puVar26;
  long lVar27;
  Schema *this_02;
  Table *table_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> resizingbuf;
  string bfbsfile;
  string hp_string;
  FlatBufferBuilder stringfbb;
  FlatBufferBuilder fbb;
  Verifier resize_verifier;
  Verifier verifier;
  
  bfbsfile._M_dataplus._M_p = (pointer)&bfbsfile.field_2;
  bfbsfile._M_string_length = 0;
  bfbsfile.field_2._M_local_buf[0] = '\0';
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stringfbb,
                 tests_data_path,"monster_test.bfbs");
  bVar3 = LoadFile((char *)stringfbb.buf_.allocator_,true,&bfbsfile);
  TestEq<bool,bool>(bVar3,true,
                    "\'flatbuffers::LoadFile((tests_data_path + \"monster_test.bfbs\").c_str(), true, &bfbsfile)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x17,"");
  std::__cxx11::string::~string((string *)&stringfbb);
  VerifierTemplate<false>::VerifierTemplate
            (&verifier,(uint8_t *)bfbsfile._M_dataplus._M_p,bfbsfile._M_string_length,0x40,1000000,
             true);
  bVar3 = reflection::VerifySchemaBuffer(&verifier);
  TestEq<bool,bool>(bVar3,true,"\'reflection::VerifySchemaBuffer(verifier)\' != \'true\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x1c,"");
  if (bfbsfile._M_dataplus._M_p == (pointer)0x0) {
    this_02 = (Schema *)0x0;
  }
  else {
    this_02 = (Schema *)(bfbsfile._M_dataplus._M_p + *(uint *)bfbsfile._M_dataplus._M_p);
  }
  pOVar6 = reflection::Schema::root_table(this_02);
  pSVar7 = reflection::Object::name(pOVar6);
  TestEqStr((char *)(pSVar7 + 1),"MyGame.Example.Monster",
            "\'root_table->name()->c_str()\' != \'\"MyGame.Example.Monster\"\'",
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
            ,0x23,"");
  pSVar7 = reflection::Object::declaration_file(pOVar6);
  TestEqStr((char *)(pSVar7 + 1),"//monster_test.fbs",
            "\'root_table->declaration_file()->c_str()\' != \'\"//monster_test.fbs\"\'",
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
            ,0x24,"");
  pVVar8 = reflection::Schema::objects(this_02);
  pOVar9 = Vector<flatbuffers::Offset<reflection::Object>,unsigned_int>::LookupByKey<char_const*>
                     ((Vector<flatbuffers::Offset<reflection::Object>,unsigned_int> *)pVVar8,
                      "TableA");
  pSVar7 = reflection::Object::declaration_file(pOVar9);
  TestEqStr((char *)(pSVar7 + 1),"//include_test/include_test1.fbs",
            "\'schema.objects()->LookupByKey(\"TableA\")->declaration_file()->c_str()\' != \'\"//include_test/include_test1.fbs\"\'"
            ,
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
            ,0x27,"");
  pVVar8 = reflection::Schema::objects(this_02);
  pOVar9 = Vector<flatbuffers::Offset<reflection::Object>,unsigned_int>::LookupByKey<char_const*>
                     ((Vector<flatbuffers::Offset<reflection::Object>,unsigned_int> *)pVVar8,
                      "MyGame.OtherNameSpace.Unused");
  pSVar7 = reflection::Object::declaration_file(pOVar9);
  TestEqStr((char *)(pSVar7 + 1),"//include_test/sub/include_test2.fbs",
            "\'schema.objects() ->LookupByKey(\"MyGame.OtherNameSpace.Unused\") ->declaration_file() ->c_str()\' != \'\"//include_test/sub/include_test2.fbs\"\'"
            ,
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
            ,0x2c,"");
  this = reflection::Schema::enums(this_02);
  this_00 = Vector<flatbuffers::Offset<reflection::Enum>,unsigned_int>::LookupByKey<char_const*>
                      ((Vector<flatbuffers::Offset<reflection::Enum>,unsigned_int> *)this,
                       "MyGame.OtherNameSpace.FromInclude");
  pSVar7 = reflection::Enum::declaration_file(this_00);
  TestEqStr((char *)(pSVar7 + 1),"//include_test/sub/include_test2.fbs",
            "\'schema.enums() ->LookupByKey(\"MyGame.OtherNameSpace.FromInclude\") ->declaration_file() ->c_str()\' != \'\"//include_test/sub/include_test2.fbs\"\'"
            ,
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
            ,0x31,"");
  pVVar10 = reflection::Schema::fbs_files(this_02);
  TestEq<unsigned_int,int>
            (*(uint *)pVVar10,3,"\'schema.fbs_files()->size()\' != \'3\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
             ,0x34,"");
  pVVar10 = reflection::Schema::fbs_files(this_02);
  pSVar11 = Vector<flatbuffers::Offset<reflection::SchemaFile>,_unsigned_int>::Get(pVVar10,0);
  pSVar7 = reflection::SchemaFile::filename(pSVar11);
  TestEqStr((char *)(pSVar7 + 1),"//include_test/include_test1.fbs",
            "\'fbs0->filename()->c_str()\' != \'\"//include_test/include_test1.fbs\"\'",
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
            ,0x37,"");
  pVVar12 = reflection::SchemaFile::included_filenames(pSVar11);
  TestEq<unsigned_int,int>
            (*(uint *)pVVar12,2,"\'fbs0_includes->size()\' != \'2\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
             ,0x39,"");
  pSVar13 = Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>::Get(pVVar12,0);
  TestEqStr((char *)(pSVar13 + 1),"//include_test/include_test1.fbs",
            "\'fbs0_includes->Get(0)->c_str()\' != \'\"//include_test/include_test1.fbs\"\'",
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
            ,0x3d,"");
  pSVar13 = Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>::Get(pVVar12,1);
  TestEqStr((char *)(pSVar13 + 1),"//include_test/sub/include_test2.fbs",
            "\'fbs0_includes->Get(1)->c_str()\' != \'\"//include_test/sub/include_test2.fbs\"\'",
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
            ,0x3f,"");
  pVVar10 = reflection::Schema::fbs_files(this_02);
  pSVar11 = Vector<flatbuffers::Offset<reflection::SchemaFile>,_unsigned_int>::Get(pVVar10,1);
  pSVar7 = reflection::SchemaFile::filename(pSVar11);
  TestEqStr((char *)(pSVar7 + 1),"//include_test/sub/include_test2.fbs",
            "\'fbs1->filename()->c_str()\' != \'\"//include_test/sub/include_test2.fbs\"\'",
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
            ,0x43,"");
  pVVar12 = reflection::SchemaFile::included_filenames(pSVar11);
  TestEq<unsigned_int,int>
            (*(uint *)pVVar12,2,"\'fbs1_includes->size()\' != \'2\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
             ,0x45,"");
  pSVar13 = Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>::Get(pVVar12,0);
  TestEqStr((char *)(pSVar13 + 1),"//include_test/include_test1.fbs",
            "\'fbs1_includes->Get(0)->c_str()\' != \'\"//include_test/include_test1.fbs\"\'",
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
            ,0x47,"");
  pSVar13 = Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>::Get(pVVar12,1);
  TestEqStr((char *)(pSVar13 + 1),"//include_test/sub/include_test2.fbs",
            "\'fbs1_includes->Get(1)->c_str()\' != \'\"//include_test/sub/include_test2.fbs\"\'",
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
            ,0x49,"");
  pVVar10 = reflection::Schema::fbs_files(this_02);
  pSVar11 = Vector<flatbuffers::Offset<reflection::SchemaFile>,_unsigned_int>::Get(pVVar10,2);
  pSVar7 = reflection::SchemaFile::filename(pSVar11);
  TestEqStr((char *)(pSVar7 + 1),"//monster_test.fbs",
            "\'fbs2->filename()->c_str()\' != \'\"//monster_test.fbs\"\'",
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
            ,0x4c,"");
  pVVar12 = reflection::SchemaFile::included_filenames(pSVar11);
  TestEq<unsigned_int,int>
            (*(uint *)pVVar12,1,"\'fbs2_includes->size()\' != \'1\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
             ,0x4e,"");
  pSVar13 = Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>::Get(pVVar12,0);
  TestEqStr((char *)(pSVar13 + 1),"//include_test/include_test1.fbs",
            "\'fbs2_includes->Get(0)->c_str()\' != \'\"//include_test/include_test1.fbs\"\'",
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
            ,0x50,"");
  this_01 = reflection::Object::fields(pOVar6);
  table = &Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::LookupByKey<char_const*>
                     ((Vector<flatbuffers::Offset<reflection::Field>,unsigned_int> *)this_01,"hp")->
           super_Table;
  TestEq<bool,bool>(true,table != (Table *)0x0,"\'nullptr\' == \'hp_field_ptr\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x55,"");
  pSVar7 = reflection::Field::name((Field *)table);
  TestEqStr((char *)(pSVar7 + 1),"hp","\'hp_field.name()->c_str()\' != \'\"hp\"\'",
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
            ,0x57,"");
  expval_00 = reflection::Field::id((Field *)table);
  TestEq<unsigned_short,int>
            (expval_00,2,"\'hp_field.id()\' != \'2\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
             ,0x58,"");
  pTVar14 = reflection::Field::type((Field *)table);
  BVar5 = reflection::Type::base_type(pTVar14);
  TestEq<reflection::BaseType,reflection::BaseType>
            (BVar5,Short,"\'hp_field.type()->base_type()\' != \'reflection::Short\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
             ,0x59,"");
  pFVar15 = Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::LookupByKey<char_const*>
                      ((Vector<flatbuffers::Offset<reflection::Field>,unsigned_int> *)this_01,
                       "friendly");
  TestEq<bool,bool>(true,pFVar15 != (return_type)0x0,"\'nullptr\' == \'friendly_field_ptr\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x5c,"");
  pVVar16 = reflection::Field::attributes(pFVar15);
  TestEq<bool,bool>(true,pVVar16 !=
                         (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)0x0,
                    "\'nullptr\' == \'friendly_field_ptr->attributes()\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x5d,"");
  pVVar16 = reflection::Field::attributes(pFVar15);
  pKVar17 = Vector<flatbuffers::Offset<reflection::KeyValue>,unsigned_int>::LookupByKey<char_const*>
                      ((Vector<flatbuffers::Offset<reflection::KeyValue>,unsigned_int> *)pVVar16,
                       "priority");
  TestEq<bool,bool>(true,pKVar17 != (return_type)0x0,
                    "\'nullptr\' == \'friendly_field_ptr->attributes()->LookupByKey(\"priority\")\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x5e,"");
  pFVar15 = Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::LookupByKey<char_const*>
                      ((Vector<flatbuffers::Offset<reflection::Field>,unsigned_int> *)this_01,"pos")
  ;
  TestEq<bool,bool>(true,pFVar15 != (return_type)0x0,"\'nullptr\' == \'pos_field_ptr\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x62,"");
  pTVar14 = reflection::Field::type(pFVar15);
  BVar5 = reflection::Type::base_type(pTVar14);
  pcVar18 = (char *)0xf;
  TestEq<reflection::BaseType,reflection::BaseType>
            (BVar5,Obj,"\'pos_field_ptr->type()->base_type()\' != \'reflection::Obj\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
             ,99,"");
  pVVar8 = reflection::Schema::objects(this_02);
  pTVar14 = reflection::Field::type(pFVar15);
  pcVar18 = reflection::Type::index(pTVar14,pcVar18,__c);
  pOVar9 = Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::Get(pVVar8,(uint)pcVar18);
  TestEq<bool,bool>(true,pOVar9 != (return_type)0x0,"\'nullptr\' == \'pos_table_ptr\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x65,"");
  pSVar7 = reflection::Object::name(pOVar9);
  TestEqStr((char *)(pSVar7 + 1),"MyGame.Example.Vec3",
            "\'pos_table_ptr->name()->c_str()\' != \'\"MyGame.Example.Vec3\"\'",
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
            ,0x66,"");
  bVar3 = reflection::Field::optional((Field *)table);
  TestEq<bool,bool>(bVar3,false,"\'hp_field.optional()\' != \'false\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x6a,"");
  bVar3 = reflection::Field::optional(pFVar15);
  TestEq<bool,bool>(bVar3,true,"\'pos_field_ptr->optional()\' != \'true\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x6b,"");
  pFVar19 = Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::LookupByKey<char_const*>
                      ((Vector<flatbuffers::Offset<reflection::Field>,unsigned_int> *)this_01,"name"
                      );
  bVar3 = reflection::Field::optional(pFVar19);
  TestEq<bool,bool>(bVar3,false,"\'fields->LookupByKey(\"name\")->optional()\' != \'false\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x6c,"");
  if (flatbuf == (uint8_t *)0x0) {
    table_00 = (Table *)0x0;
  }
  else {
    table_00 = (Table *)(flatbuf + *(uint *)flatbuf);
  }
  pOVar20 = reflection::Schema::root_table(this_02);
  bVar3 = flatbuffers::Verify(this_02,pOVar20,flatbuf,length,0x40,1000000);
  TestEq<bool,bool>(bVar3,true,
                    "\'flatbuffers::Verify(schema, *schema.root_table(), flatbuf, length)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x73,"");
  uVar4 = GetFieldI<unsigned_short>(table_00,(Field *)table);
  TestEq<unsigned_short,int>
            (uVar4,0x50,"\'hp\' != \'80\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
             ,0x76,"");
  iVar21 = GetAnyFieldI(table_00,(Field *)table);
  schema = (Schema *)0x7b;
  TestEq<long,int>(iVar21,0x50,"\'hp_int64\' != \'80\'",
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
                   ,0x7b,"");
  dVar1 = GetAnyFieldF(table_00,(Field *)table);
  TestEq<double,double>
            (dVar1,80.0,"\'hp_double\' != \'80.0\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
             ,0x7d,"");
  GetAnyFieldS_abi_cxx11_(&hp_string,(flatbuffers *)table_00,table,(Field *)this_02,schema);
  TestEqStr(hp_string._M_dataplus._M_p,"80","\'hp_string.c_str()\' != \'\"80\"\'",
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
            ,0x7f,"");
  pSVar22 = GetFieldStruct(table_00,pFVar15);
  TestEq<bool,bool>(true,pSVar22 != (Struct *)0x0,"\'nullptr\' == \'pos_struct\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x83,"");
  pVVar23 = reflection::Object::fields(pOVar9);
  pFVar15 = Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::LookupByKey<char_const*>
                      ((Vector<flatbuffers::Offset<reflection::Field>,unsigned_int> *)pVVar23,"z");
  dVar1 = GetAnyFieldF(pSVar22,pFVar15);
  TestEq<double,float>
            (dVar1,3.0,
             "\'flatbuffers::GetAnyFieldF(*pos_struct, *pos_table_ptr->fields()->LookupByKey(\"z\"))\' != \'3.0f\'"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
             ,0x86,"");
  pVVar23 = reflection::Object::fields(pOVar9);
  pFVar15 = Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::LookupByKey<char_const*>
                      ((Vector<flatbuffers::Offset<reflection::Field>,unsigned_int> *)pVVar23,
                       "test3");
  pSVar22 = GetFieldStruct(pSVar22,pFVar15);
  pcVar18 = (char *)(ulong)(pSVar22 != (Struct *)0x0);
  TestEq<bool,bool>(true,pSVar22 != (Struct *)0x0,"\'nullptr\' == \'test3_struct\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x8a,"");
  pVVar8 = reflection::Schema::objects(this_02);
  pTVar14 = reflection::Field::type(pFVar15);
  pcVar18 = reflection::Type::index(pTVar14,pcVar18,__c_00);
  pOVar9 = Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::Get(pVVar8,(uint)pcVar18);
  pVVar23 = reflection::Object::fields(pOVar9);
  pFVar15 = Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::LookupByKey<char_const*>
                      ((Vector<flatbuffers::Offset<reflection::Field>,unsigned_int> *)pVVar23,"a");
  dVar1 = GetAnyFieldF(pSVar22,pFVar15);
  TestEq<double,int>(dVar1,10,
                     "\'flatbuffers::GetAnyFieldF(*test3_struct, *test3_object->fields()->LookupByKey(\"a\"))\' != \'10\'"
                     ,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
                     ,0x8f,"");
  SetField<unsigned_short>(table_00,(Field *)table,200);
  uVar4 = GetFieldI<unsigned_short>(table_00,(Field *)table);
  TestEq<unsigned_short,int>
            (uVar4,200,"\'hp\' != \'200\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
             ,0x94,"");
  SetAnyFieldI(table_00,(Field *)table,300);
  iVar21 = GetAnyFieldI(table_00,(Field *)table);
  TestEq<long,int>(iVar21,300,"\'hp_int64\' != \'300\'",
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
                   ,0x99,"");
  SetAnyFieldF(table_00,(Field *)table,300.5);
  iVar21 = GetAnyFieldI(table_00,(Field *)table);
  TestEq<long,int>(iVar21,300,"\'hp_int64\' != \'300\'",
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
                   ,0x9c,"");
  SetAnyFieldS(table_00,(Field *)table,"300");
  iVar21 = GetAnyFieldI(table_00,(Field *)table);
  TestEq<long,int>(iVar21,300,"\'hp_int64\' != \'300\'",
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
                   ,0x9f,"");
  pOVar20 = reflection::Schema::root_table(this_02);
  bVar3 = flatbuffers::Verify(this_02,pOVar20,flatbuf,length,0x40,1000000);
  TestEq<bool,bool>(bVar3,true,
                    "\'flatbuffers::Verify(schema, *schema.root_table(), flatbuf, length)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
                    ,0xa3,"");
  SetField<unsigned_short>(table_00,(Field *)table,0x50);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&resizingbuf,flatbuf,
             flatbuf + length,(allocator_type *)&stringfbb);
  pFVar15 = Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::LookupByKey<char_const*>
                      ((Vector<flatbuffers::Offset<reflection::Field>,unsigned_int> *)this_01,"name"
                      );
  puVar2 = resizingbuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (resizingbuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    puVar26 = (pointer)0x0;
  }
  else {
    puVar26 = resizingbuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start +
              *(uint *)resizingbuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stringfbb,"totally new string",(allocator<char> *)&fbb);
  lVar27 = (long)puVar26 - (long)puVar2;
  pSVar7 = GetFieldS((Table *)(resizingbuf.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar27),pFVar15);
  SetString(this_02,(string *)&stringfbb,pSVar7,&resizingbuf,(Object *)0x0);
  std::__cxx11::string::~string((string *)&stringfbb);
  pSVar7 = GetFieldS((Table *)(resizingbuf.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar27),pFVar15);
  TestEqStr((char *)(pSVar7 + 1),"totally new string",
            "\'GetFieldS(**rroot, name_field)->c_str()\' != \'\"totally new string\"\'",
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
            ,0xb5,"");
  pFVar19 = Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::LookupByKey<char_const*>
                      ((Vector<flatbuffers::Offset<reflection::Field>,unsigned_int> *)this_01,
                       "inventory");
  vec = GetFieldV<unsigned_char>
                  ((Table *)(resizingbuf.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar27),pFVar19);
  lVar25 = (long)vec -
           (long)resizingbuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  ResizeVector<unsigned_char>(this_02,0x6e,'2',vec,&resizingbuf,(Object *)0x0);
  expval = Vector<unsigned_char,_unsigned_int>::Get
                     ((Vector<unsigned_char,_unsigned_int> *)
                      (resizingbuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar25),10);
  TestEq<unsigned_char,int>
            (expval,0x32,"\'rinventory->Get(10)\' != \'50\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
             ,0xbd,"");
  pFVar19 = Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::LookupByKey<char_const*>
                      ((Vector<flatbuffers::Offset<reflection::Field>,unsigned_int> *)this_01,
                       "testarrayofstring");
  pVVar12 = GetFieldV<flatbuffers::Offset<flatbuffers::String>>
                      ((Table *)(resizingbuf.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar27),pFVar19);
  lVar25 = (long)pVVar12 -
           (long)resizingbuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  ResizeVector<flatbuffers::Offset<flatbuffers::String>>
            (this_02,3,(Offset<flatbuffers::String>)0x0,pVVar12,&resizingbuf,(Object *)0x0);
  stringfbb.buf_.allocator_ = (Allocator *)0x0;
  stringfbb.buf_.own_allocator_ = false;
  stringfbb.buf_.initial_size_ = 0x400;
  stringfbb.buf_.max_size_ = 0x7fffffff;
  stringfbb.buf_.buffer_minalign_ = 8;
  stringfbb.buf_.reserved_ = 0;
  stringfbb.buf_.size_ = 0;
  stringfbb.length_of_64_bit_region_ = 0;
  stringfbb.nested = false;
  stringfbb.finished = false;
  stringfbb.buf_.buf_ = (uint8_t *)0x0;
  stringfbb.buf_.cur_._0_6_ = 0;
  stringfbb.buf_.cur_._6_2_ = 0;
  stringfbb.buf_.scratch_._0_6_ = 0;
  stringfbb._78_8_ = 0;
  stringfbb.minalign_ = 1;
  stringfbb.force_defaults_ = false;
  stringfbb.dedup_vtables_ = true;
  stringfbb.string_pool = (StringOffsetMap *)0x0;
  root = FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>(&stringfbb,"hank");
  FlatBufferBuilderImpl<false>::Finish<flatbuffers::String>(&stringfbb,root,(char *)0x0);
  puVar24 = FlatBufferBuilderImpl<false>::GetBufferPointer(&stringfbb);
  puVar24 = AddFlatBuffer(&resizingbuf,puVar24,(ulong)stringfbb.buf_.size_);
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>::MutateOffset
            ((Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)
             (resizingbuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start + lVar25),2,puVar24);
  pSVar13 = Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>::Get
                      ((Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)
                       (resizingbuf.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar25),0);
  TestEqStr((char *)(pSVar13 + 1),"bob","\'rtestarrayofstring->Get(0)->c_str()\' != \'\"bob\"\'",
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
            ,0xd9,"");
  pSVar13 = Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>::Get
                      ((Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)
                       (resizingbuf.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar25),2);
  TestEqStr((char *)(pSVar13 + 1),"hank","\'rtestarrayofstring->Get(2)->c_str()\' != \'\"hank\"\'",
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
            ,0xda,"");
  VerifierTemplate<false>::VerifierTemplate
            (&resize_verifier,
             resizingbuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             (long)resizingbuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)resizingbuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,0x40,1000000,true);
  bVar3 = MyGame::Example::VerifyMonsterBuffer(&resize_verifier);
  TestEq<bool,bool>(bVar3,true,"\'VerifyMonsterBuffer(resize_verifier)\' != \'true\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
                    ,0xdf,"");
  pOVar20 = reflection::Schema::root_table(this_02);
  bVar3 = flatbuffers::Verify(this_02,pOVar20,
                              resizingbuf.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)resizingbuf.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)resizingbuf.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,0x40,1000000);
  TestEq<bool,bool>(bVar3,true,
                    "\'flatbuffers::Verify(schema, *schema.root_table(), resizingbuf.data(), resizingbuf.size())\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
                    ,0xe4,"");
  SetFieldT((Table *)(resizingbuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar27),pFVar15,puVar24);
  pSVar7 = GetFieldS((Table *)(resizingbuf.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar27),pFVar15);
  TestEqStr((char *)(pSVar7 + 1),"hank",
            "\'GetFieldS(**rroot, name_field)->c_str()\' != \'\"hank\"\'",
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
            ,0xea,"");
  fbb.buf_.allocator_ = (Allocator *)0x0;
  fbb.buf_.own_allocator_ = false;
  fbb.buf_.initial_size_ = 0x400;
  fbb.buf_.max_size_ = 0x7fffffff;
  fbb.buf_.buffer_minalign_ = 8;
  fbb.buf_.reserved_ = 0;
  fbb.buf_.size_ = 0;
  fbb.length_of_64_bit_region_ = 0;
  fbb.nested = false;
  fbb.finished = false;
  fbb.buf_.buf_ = (uint8_t *)0x0;
  fbb.buf_.cur_._0_6_ = 0;
  fbb.buf_.cur_._6_2_ = 0;
  fbb.buf_.scratch_._0_6_ = 0;
  fbb._78_8_ = 0;
  fbb.minalign_ = 1;
  fbb.force_defaults_ = false;
  fbb.dedup_vtables_ = true;
  fbb.string_pool = (StringOffsetMap *)0x0;
  root_00 = CopyTable(&fbb,this_02,pOVar6,(Table *)(flatbuf + *(uint *)flatbuf),true);
  FlatBufferBuilderImpl<false>::Finish<flatbuffers::Table_const*>(&fbb,root_00,"MONS");
  puVar24 = FlatBufferBuilderImpl<false>::GetBufferPointer(&fbb);
  AccessFlatBufferTest(puVar24,(ulong)fbb.buf_.size_,true);
  pOVar6 = reflection::Schema::root_table(this_02);
  puVar24 = FlatBufferBuilderImpl<false>::GetBufferPointer(&fbb);
  bVar3 = flatbuffers::Verify(this_02,pOVar6,puVar24,(ulong)fbb.buf_.size_,0x40,1000000);
  TestEq<bool,bool>(bVar3,true,
                    "\'flatbuffers::Verify(schema, *schema.root_table(), fbb.GetBufferPointer(), fbb.GetSize())\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/reflection_test.cpp"
                    ,0xf9,"");
  FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&fbb);
  FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&stringfbb);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&resizingbuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::__cxx11::string::~string((string *)&hp_string);
  std::__cxx11::string::~string((string *)&bfbsfile);
  return;
}

Assistant:

void ReflectionTest(const std::string &tests_data_path, uint8_t *flatbuf,
                    size_t length) {
  // Load a binary schema.
  std::string bfbsfile;
  TEST_EQ(flatbuffers::LoadFile((tests_data_path + "monster_test.bfbs").c_str(),
                                true, &bfbsfile),
          true);

  // Verify it, just in case:
  flatbuffers::Verifier verifier(
      reinterpret_cast<const uint8_t *>(bfbsfile.c_str()), bfbsfile.length());
  TEST_EQ(reflection::VerifySchemaBuffer(verifier), true);

  // Make sure the schema is what we expect it to be.
  auto &schema = *reflection::GetSchema(bfbsfile.c_str());
  auto root_table = schema.root_table();

  // Check the declaration files.
  TEST_EQ_STR(root_table->name()->c_str(), "MyGame.Example.Monster");
  TEST_EQ_STR(root_table->declaration_file()->c_str(), "//monster_test.fbs");
  TEST_EQ_STR(
      schema.objects()->LookupByKey("TableA")->declaration_file()->c_str(),
      "//include_test/include_test1.fbs");
  TEST_EQ_STR(schema.objects()
                  ->LookupByKey("MyGame.OtherNameSpace.Unused")
                  ->declaration_file()
                  ->c_str(),
              "//include_test/sub/include_test2.fbs");
  TEST_EQ_STR(schema.enums()
                  ->LookupByKey("MyGame.OtherNameSpace.FromInclude")
                  ->declaration_file()
                  ->c_str(),
              "//include_test/sub/include_test2.fbs");

  // Check scheam filenames and their includes.
  TEST_EQ(schema.fbs_files()->size(), 3);

  const auto fbs0 = schema.fbs_files()->Get(0);
  TEST_EQ_STR(fbs0->filename()->c_str(), "//include_test/include_test1.fbs");
  const auto fbs0_includes = fbs0->included_filenames();
  TEST_EQ(fbs0_includes->size(), 2);

  // TODO(caspern): Should we force or disallow inclusion of self?
  TEST_EQ_STR(fbs0_includes->Get(0)->c_str(),
              "//include_test/include_test1.fbs");
  TEST_EQ_STR(fbs0_includes->Get(1)->c_str(),
              "//include_test/sub/include_test2.fbs");

  const auto fbs1 = schema.fbs_files()->Get(1);
  TEST_EQ_STR(fbs1->filename()->c_str(),
              "//include_test/sub/include_test2.fbs");
  const auto fbs1_includes = fbs1->included_filenames();
  TEST_EQ(fbs1_includes->size(), 2);
  TEST_EQ_STR(fbs1_includes->Get(0)->c_str(),
              "//include_test/include_test1.fbs");
  TEST_EQ_STR(fbs1_includes->Get(1)->c_str(),
              "//include_test/sub/include_test2.fbs");

  const auto fbs2 = schema.fbs_files()->Get(2);
  TEST_EQ_STR(fbs2->filename()->c_str(), "//monster_test.fbs");
  const auto fbs2_includes = fbs2->included_filenames();
  TEST_EQ(fbs2_includes->size(), 1);
  TEST_EQ_STR(fbs2_includes->Get(0)->c_str(),
              "//include_test/include_test1.fbs");

  // Check Root table fields
  auto fields = root_table->fields();
  auto hp_field_ptr = fields->LookupByKey("hp");
  TEST_NOTNULL(hp_field_ptr);
  auto &hp_field = *hp_field_ptr;
  TEST_EQ_STR(hp_field.name()->c_str(), "hp");
  TEST_EQ(hp_field.id(), 2);
  TEST_EQ(hp_field.type()->base_type(), reflection::Short);

  auto friendly_field_ptr = fields->LookupByKey("friendly");
  TEST_NOTNULL(friendly_field_ptr);
  TEST_NOTNULL(friendly_field_ptr->attributes());
  TEST_NOTNULL(friendly_field_ptr->attributes()->LookupByKey("priority"));

  // Make sure the table index is what we expect it to be.
  auto pos_field_ptr = fields->LookupByKey("pos");
  TEST_NOTNULL(pos_field_ptr);
  TEST_EQ(pos_field_ptr->type()->base_type(), reflection::Obj);
  auto pos_table_ptr = schema.objects()->Get(pos_field_ptr->type()->index());
  TEST_NOTNULL(pos_table_ptr);
  TEST_EQ_STR(pos_table_ptr->name()->c_str(), "MyGame.Example.Vec3");

  // Test nullability of fields: hp is a 0-default scalar, pos is a struct =>
  // optional, and name is a required string => not optional.
  TEST_EQ(hp_field.optional(), false);
  TEST_EQ(pos_field_ptr->optional(), true);
  TEST_EQ(fields->LookupByKey("name")->optional(), false);

  // Now use it to dynamically access a buffer.
  auto &root = *flatbuffers::GetAnyRoot(flatbuf);

  // Verify the buffer first using reflection based verification
  TEST_EQ(flatbuffers::Verify(schema, *schema.root_table(), flatbuf, length),
          true);

  auto hp = flatbuffers::GetFieldI<uint16_t>(root, hp_field);
  TEST_EQ(hp, 80);

  // Rather than needing to know the type, we can also get the value of
  // any field as an int64_t/double/string, regardless of what it actually is.
  auto hp_int64 = flatbuffers::GetAnyFieldI(root, hp_field);
  TEST_EQ(hp_int64, 80);
  auto hp_double = flatbuffers::GetAnyFieldF(root, hp_field);
  TEST_EQ(hp_double, 80.0);
  auto hp_string = flatbuffers::GetAnyFieldS(root, hp_field, &schema);
  TEST_EQ_STR(hp_string.c_str(), "80");

  // Get struct field through reflection
  auto pos_struct = flatbuffers::GetFieldStruct(root, *pos_field_ptr);
  TEST_NOTNULL(pos_struct);
  TEST_EQ(flatbuffers::GetAnyFieldF(*pos_struct,
                                    *pos_table_ptr->fields()->LookupByKey("z")),
          3.0f);

  auto test3_field = pos_table_ptr->fields()->LookupByKey("test3");
  auto test3_struct = flatbuffers::GetFieldStruct(*pos_struct, *test3_field);
  TEST_NOTNULL(test3_struct);
  auto test3_object = schema.objects()->Get(test3_field->type()->index());

  TEST_EQ(flatbuffers::GetAnyFieldF(*test3_struct,
                                    *test3_object->fields()->LookupByKey("a")),
          10);

  // We can also modify it.
  flatbuffers::SetField<uint16_t>(&root, hp_field, 200);
  hp = flatbuffers::GetFieldI<uint16_t>(root, hp_field);
  TEST_EQ(hp, 200);

  // We can also set fields generically:
  flatbuffers::SetAnyFieldI(&root, hp_field, 300);
  hp_int64 = flatbuffers::GetAnyFieldI(root, hp_field);
  TEST_EQ(hp_int64, 300);
  flatbuffers::SetAnyFieldF(&root, hp_field, 300.5);
  hp_int64 = flatbuffers::GetAnyFieldI(root, hp_field);
  TEST_EQ(hp_int64, 300);
  flatbuffers::SetAnyFieldS(&root, hp_field, "300");
  hp_int64 = flatbuffers::GetAnyFieldI(root, hp_field);
  TEST_EQ(hp_int64, 300);

  // Test buffer is valid after the modifications
  TEST_EQ(flatbuffers::Verify(schema, *schema.root_table(), flatbuf, length),
          true);

  // Reset it, for further tests.
  flatbuffers::SetField<uint16_t>(&root, hp_field, 80);

  // More advanced functionality: changing the size of items in-line!
  // First we put the FlatBuffer inside an std::vector.
  std::vector<uint8_t> resizingbuf(flatbuf, flatbuf + length);
  // Find the field we want to modify.
  auto &name_field = *fields->LookupByKey("name");
  // Get the root.
  // This time we wrap the result from GetAnyRoot in a smartpointer that
  // will keep rroot valid as resizingbuf resizes.
  auto rroot = flatbuffers::piv(flatbuffers::GetAnyRoot(resizingbuf.data()),
                                resizingbuf);
  SetString(schema, "totally new string", GetFieldS(**rroot, name_field),
            &resizingbuf);
  // Here resizingbuf has changed, but rroot is still valid.
  TEST_EQ_STR(GetFieldS(**rroot, name_field)->c_str(), "totally new string");
  // Now lets extend a vector by 100 elements (10 -> 110).
  auto &inventory_field = *fields->LookupByKey("inventory");
  auto rinventory = flatbuffers::piv(
      flatbuffers::GetFieldV<uint8_t>(**rroot, inventory_field), resizingbuf);
  flatbuffers::ResizeVector<uint8_t>(schema, 110, 50, *rinventory,
                                     &resizingbuf);
  // rinventory still valid, so lets read from it.
  TEST_EQ(rinventory->Get(10), 50);

  // For reflection uses not covered already, there is a more powerful way:
  // we can simply generate whatever object we want to add/modify in a
  // FlatBuffer of its own, then add that to an existing FlatBuffer:
  // As an example, let's add a string to an array of strings.
  // First, find our field:
  auto &testarrayofstring_field = *fields->LookupByKey("testarrayofstring");
  // Find the vector value:
  auto rtestarrayofstring = flatbuffers::piv(
      flatbuffers::GetFieldV<flatbuffers::Offset<flatbuffers::String>>(
          **rroot, testarrayofstring_field),
      resizingbuf);
  // It's a vector of 2 strings, to which we add one more, initialized to
  // offset 0.
  flatbuffers::ResizeVector<flatbuffers::Offset<flatbuffers::String>>(
      schema, 3, 0, *rtestarrayofstring, &resizingbuf);
  // Here we just create a buffer that contans a single string, but this
  // could also be any complex set of tables and other values.
  flatbuffers::FlatBufferBuilder stringfbb;
  stringfbb.Finish(stringfbb.CreateString("hank"));
  // Add the contents of it to our existing FlatBuffer.
  // We do this last, so the pointer doesn't get invalidated (since it is
  // at the end of the buffer):
  auto string_ptr = flatbuffers::AddFlatBuffer(
      resizingbuf, stringfbb.GetBufferPointer(), stringfbb.GetSize());
  // Finally, set the new value in the vector.
  rtestarrayofstring->MutateOffset(2, string_ptr);
  TEST_EQ_STR(rtestarrayofstring->Get(0)->c_str(), "bob");
  TEST_EQ_STR(rtestarrayofstring->Get(2)->c_str(), "hank");
  // Test integrity of all resize operations above.
  flatbuffers::Verifier resize_verifier(
      reinterpret_cast<const uint8_t *>(resizingbuf.data()),
      resizingbuf.size());
  TEST_EQ(VerifyMonsterBuffer(resize_verifier), true);

  // Test buffer is valid using reflection as well
  TEST_EQ(flatbuffers::Verify(schema, *schema.root_table(), resizingbuf.data(),
                              resizingbuf.size()),
          true);

  // As an additional test, also set it on the name field.
  // Note: unlike the name change above, this just overwrites the offset,
  // rather than changing the string in-place.
  SetFieldT(*rroot, name_field, string_ptr);
  TEST_EQ_STR(GetFieldS(**rroot, name_field)->c_str(), "hank");

  // Using reflection, rather than mutating binary FlatBuffers, we can also copy
  // tables and other things out of other FlatBuffers into a FlatBufferBuilder,
  // either part or whole.
  flatbuffers::FlatBufferBuilder fbb;
  auto root_offset = flatbuffers::CopyTable(
      fbb, schema, *root_table, *flatbuffers::GetAnyRoot(flatbuf), true);
  fbb.Finish(root_offset, MonsterIdentifier());
  // Test that it was copied correctly:
  AccessFlatBufferTest(fbb.GetBufferPointer(), fbb.GetSize());

  // Test buffer is valid using reflection as well
  TEST_EQ(flatbuffers::Verify(schema, *schema.root_table(),
                              fbb.GetBufferPointer(), fbb.GetSize()),
          true);
}